

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

FIOBJ fiobj_str_buf(size_t capa)

{
  void *__src;
  undefined1 *puVar1;
  void *pvVar2;
  int *piVar3;
  ulong extraout_RDX;
  ulong uVar4;
  size_t needed;
  byte *in_RSI;
  ulong *puVar5;
  char *format;
  ulong uVar6;
  fio_str_info_s fStack_28;
  
  if (capa == 0) {
    needed = sysconf(0x1e);
  }
  else {
    needed = capa + 1;
  }
  puVar5 = (ulong *)0x40;
  puVar1 = (undefined1 *)fio_malloc(0x40);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x28;
    *(undefined4 *)(puVar1 + 4) = 1;
    *(undefined8 *)(puVar1 + 8) = 0;
    puVar1[0x10] = 1;
    *(undefined8 *)(puVar1 + 0x11) = 0;
    *(undefined8 *)(puVar1 + 0x19) = 0;
    *(undefined8 *)(puVar1 + 0x21) = 0;
    *(undefined8 *)(puVar1 + 0x29) = 0;
    *(undefined8 *)(puVar1 + 0x30) = 0;
    *(undefined8 *)(puVar1 + 0x38) = 0;
    if (needed != 0) {
      fio_str_capa_assert(&fStack_28,(fio_str_s_conflict *)(puVar1 + 0x10),needed);
    }
    return (ulong)puVar1 | 2;
  }
  fiobj_str_buf_cold_1();
  if (in_RSI == (byte *)0x0) {
LAB_001436e4:
    *puVar5 = 0;
    puVar5[1] = 0;
    puVar5[2] = 0;
    return (FIOBJ)puVar5;
  }
  if (in_RSI[1] != 0) {
    if (in_RSI != (byte *)0x0) {
      uVar6 = (ulong)*in_RSI;
      if ((uVar6 == 0) && (uVar4 = *(ulong *)(in_RSI + 0x28), uVar4 != 0)) {
        if (in_RSI[1] == 0) {
          uVar6 = *(ulong *)(in_RSI + 0x10);
        }
        else {
          uVar6 = 0;
        }
        *puVar5 = uVar6;
        puVar5[1] = *(ulong *)(in_RSI + 0x18);
        puVar5[2] = uVar4;
        return (FIOBJ)puVar5;
      }
      uVar4 = 0x2d;
      if (in_RSI[1] != 0) {
        uVar4 = 0;
      }
      *puVar5 = uVar4;
LAB_00143710:
      puVar5[1] = uVar6 >> 1;
      puVar5[2] = (ulong)(in_RSI + 2);
      return (FIOBJ)puVar5;
    }
    goto LAB_001436e4;
  }
  uVar6 = (ulong)*in_RSI;
  if ((uVar6 == 0) && (pvVar2 = *(void **)(in_RSI + 0x28), pvVar2 != (void *)0x0)) {
    if (extraout_RDX < *(ulong *)(in_RSI + 0x10)) {
      *puVar5 = *(ulong *)(in_RSI + 0x10);
      puVar5[1] = *(ulong *)(in_RSI + 0x18);
      puVar5[2] = (ulong)pvVar2;
      return (FIOBJ)puVar5;
    }
    uVar6 = extraout_RDX + 1 | 0xf;
    if (*(code **)(in_RSI + 0x20) == fio_free) {
      pvVar2 = fio_realloc2(pvVar2,uVar6 + 1,*(long *)(in_RSI + 0x18) + 1);
      if (pvVar2 != (void *)0x0) goto LAB_0014385a;
      if (FIO_LOG_LEVEL < 1) goto LAB_001438a2;
      format = 
      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4024"
      ;
    }
    else {
      pvVar2 = fio_malloc(uVar6 + 1);
      if (pvVar2 != (void *)0x0) {
        __src = *(void **)(in_RSI + 0x28);
        memcpy(pvVar2,__src,*(long *)(in_RSI + 0x18) + 1);
        if (*(code **)(in_RSI + 0x20) != (code *)0x0) {
          (**(code **)(in_RSI + 0x20))(__src);
        }
        *(code **)(in_RSI + 0x20) = fio_free;
LAB_0014385a:
        *(ulong *)(in_RSI + 0x10) = uVar6;
        *(void **)(in_RSI + 0x28) = pvVar2;
        *(undefined1 *)((long)pvVar2 + uVar6) = 0;
        *puVar5 = *(ulong *)(in_RSI + 0x10);
        puVar5[1] = *(ulong *)(in_RSI + 0x18);
        puVar5[2] = *(ulong *)(in_RSI + 0x28);
        return (FIOBJ)puVar5;
      }
      if (FIO_LOG_LEVEL < 1) goto LAB_001438a2;
      format = 
      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4027"
      ;
    }
  }
  else {
    if (extraout_RDX < 0x2e) {
      *puVar5 = 0x2d;
      goto LAB_00143710;
    }
    uVar6 = extraout_RDX + 1 | 0xf;
    puVar1 = (undefined1 *)fio_malloc(uVar6 + 1);
    if (puVar1 != (undefined1 *)0x0) {
      uVar4 = (ulong)(*in_RSI >> 1);
      if (*in_RSI < 2) {
        *puVar1 = 0;
      }
      else {
        memcpy(puVar1,in_RSI + 2,uVar4 + 1);
      }
      in_RSI[0] = 0;
      in_RSI[1] = 0;
      in_RSI[2] = 0;
      in_RSI[3] = 0;
      in_RSI[4] = 0;
      in_RSI[5] = 0;
      in_RSI[6] = 0;
      in_RSI[7] = 0;
      in_RSI[8] = 0;
      in_RSI[9] = 0;
      in_RSI[10] = 0;
      in_RSI[0xb] = 0;
      in_RSI[0xc] = 0;
      in_RSI[0xd] = 0;
      in_RSI[0xe] = 0;
      in_RSI[0xf] = 0;
      *(ulong *)(in_RSI + 0x10) = uVar6;
      *(ulong *)(in_RSI + 0x18) = uVar4;
      *(code **)(in_RSI + 0x20) = fio_free;
      *(undefined1 **)(in_RSI + 0x28) = puVar1;
      *puVar5 = uVar6;
      puVar5[1] = uVar4;
      puVar5[2] = (ulong)puVar1;
      return (FIOBJ)puVar5;
    }
    if (FIO_LOG_LEVEL < 1) goto LAB_001438a2;
    format = 
    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4042"
    ;
  }
  FIO_LOG2STDERR(format);
LAB_001438a2:
  kill(0,2);
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

FIOBJ fiobj_str_buf(size_t capa) {
  if (capa)
    capa = capa + 1;
  else
    capa = PAGE_SIZE;

  fiobj_str_s *s = fio_malloc(sizeof(*s));
  if (!s) {
    perror("ERROR: fiobj string couldn't allocate memory");
    exit(errno);
  }
  *s = (fiobj_str_s){
      .head =
          {
              .ref = 1,
              .type = FIOBJ_T_STRING,
          },
      .str = FIO_STR_INIT,
  };
  if (capa) {
    fio_str_capa_assert(&s->str, capa);
  }
  return ((uintptr_t)s | FIOBJECT_STRING_FLAG);
}